

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeSets.cpp
# Opt level: O0

void Lodtalk::dumpSistaBytecode(uint8_t *buffer,size_t size)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  int instructionSize;
  uint8_t opcode;
  size_t pos;
  size_t size_local;
  uint8_t *buffer_local;
  
  _instructionSize = 0;
  while (_instructionSize < size) {
    bVar1 = buffer[_instructionSize];
    iVar3 = getSistaBytecodeSize((uint)bVar1);
    getSistaBytecodeName_abi_cxx11_((uint)bVar1);
    uVar4 = std::__cxx11::string::c_str();
    printf("%s",uVar4);
    uVar2 = _instructionSize + 1;
    if (1 < iVar3) {
      printf(" %d",(ulong)buffer[_instructionSize + 1]);
      uVar2 = _instructionSize + 2;
    }
    _instructionSize = uVar2;
    if (2 < iVar3) {
      printf(" %d",(ulong)buffer[_instructionSize]);
      _instructionSize = _instructionSize + 1;
    }
    printf("\n");
  }
  return;
}

Assistant:

void dumpSistaBytecode(uint8_t *buffer, size_t size)
{
    size_t pos = 0;
    while(pos < size)
    {
        auto opcode = buffer[pos++];
        auto instructionSize = getSistaBytecodeSize(opcode);
        printf("%s", getSistaBytecodeName(opcode).c_str());
        if(instructionSize > 1)
            printf(" %d", buffer[pos++]);
        if(instructionSize > 2)
            printf(" %d", buffer[pos++]);
        printf("\n");
    }
}